

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator~
          (CharClass<wchar_t> *__return_storage_ptr__,CharClass<wchar_t> *this)

{
  pointer pRVar1;
  wchar_t last_end;
  wchar_t local_3c;
  wchar_t local_38 [2];
  
  CharClass(__return_storage_ptr__);
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_3c = L'\x01';
  if ((pRVar1 != (this->m_ranges).
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) && (pRVar1->m_start == L'\x01')) {
    local_3c = pRVar1->m_end;
    pRVar1 = pRVar1 + 1;
  }
  if (pRVar1 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_38[0] = pRVar1->m_start;
      std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
      emplace_back<wchar_t&,wchar_t>
                ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
                 &__return_storage_ptr__->m_ranges,&local_3c,local_38);
      local_3c = pRVar1->m_end;
      pRVar1 = pRVar1 + 1;
    } while (pRVar1 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_3c != L'\x7fffffff') {
    local_38[1] = 0x7fffffff;
    std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
    emplace_back<wchar_t&,wchar_t>
              ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
               &__return_storage_ptr__->m_ranges,&local_3c,local_38 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }